

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

InstanceBuilder * __thiscall
vkb::InstanceBuilder::enable_extensions(InstanceBuilder *this,size_t count,char **extensions)

{
  ulong local_30;
  size_t i;
  char **extensions_local;
  size_t count_local;
  InstanceBuilder *this_local;
  
  if ((extensions != (char **)0x0) && (count != 0)) {
    for (local_30 = 0; local_30 < count; local_30 = local_30 + 1) {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                (&(this->info).extensions,extensions + local_30);
    }
  }
  return this;
}

Assistant:

InstanceBuilder& InstanceBuilder::enable_extensions(size_t count, const char* const* extensions) {
    if (!extensions || count == 0) return *this;
    for (size_t i = 0; i < count; i++) {
        info.extensions.push_back(extensions[i]);
    }
    return *this;
}